

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O1

void deqp::gls::ub::anon_unknown_12::generateCompareSrc
               (ostringstream *src,char *resultVar,ShaderInterface *interface,UniformLayout *layout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *blockPointers,bool isVertex)

{
  int iVar1;
  undefined8 *puVar2;
  UniformLayout *layout_00;
  VarType *type;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_type *psVar7;
  pointer pBVar8;
  int iVar9;
  pointer pBVar10;
  long lVar11;
  ulong uVar12;
  char *__s;
  byte bVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  string instancePostfix;
  string apiPrefix;
  string srcPrefix;
  string blockInstanceName;
  undefined4 in_stack_fffffffffffffc9c;
  deUint32 in_stack_fffffffffffffca0;
  int local_348;
  allocator<char> local_342;
  allocator<char> local_341;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  long *local_320;
  long local_318;
  long local_310;
  long lStack_308;
  uint local_2fc;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  long *local_2d8;
  undefined8 local_2d0;
  long local_2c8;
  undefined8 uStack_2c0;
  VarType *local_2b8 [2];
  undefined1 local_2a8 [24];
  long local_290;
  ulong local_288 [2];
  long *local_278 [2];
  long local_268 [2];
  ulong *local_258;
  long local_250;
  ulong local_248 [2];
  UniformLayout *local_238;
  UniformLayout *local_230;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  char *local_208;
  long local_200;
  pointer local_1f8;
  ostringstream *local_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  lVar11 = *(long *)(resultVar + 0x18);
  if (0 < (int)((ulong)(*(long *)(resultVar + 0x20) - lVar11) >> 3)) {
    bVar13 = (byte)blockPointers ^ 1;
    uVar14 = (uint)bVar13 * 0x400 + 0x400;
    local_2fc = (uint)bVar13 * 0x100 + 0x100;
    local_1f8 = (pointer)&(layout->blocks).
                          super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
    local_200 = 0;
    local_238 = layout;
    local_230 = (UniformLayout *)interface;
    local_208 = resultVar;
    local_1f0 = src;
    do {
      puVar2 = *(undefined8 **)(lVar11 + local_200 * 8);
      if ((*(uint *)((long)puVar2 + 0x5c) & local_2fc) != 0) {
        bVar15 = puVar2[5] != 0;
        bVar16 = puVar2[4] != 0;
        iVar1 = *(int *)(puVar2 + 0xb);
        iVar9 = 1;
        if (1 < iVar1) {
          iVar9 = iVar1;
        }
        if (bVar16 && bVar15) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1e8,(char *)*puVar2,&local_341);
          plVar4 = (long *)std::__cxx11::string::append((char *)local_1e8);
          local_320 = &local_310;
          plVar6 = plVar4 + 2;
          if ((long *)*plVar4 == plVar6) {
            local_310 = *plVar6;
            lStack_308 = plVar4[3];
          }
          else {
            local_310 = *plVar6;
            local_320 = (long *)*plVar4;
          }
          local_318 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
        }
        else {
          local_320 = &local_310;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"");
        }
        if ((bVar16 && bVar15) && (local_1e8[0] != local_1d8)) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        if (iVar1 < 1) {
          iVar9 = 1;
        }
        local_348 = 0;
        do {
          if (iVar1 < 1) {
            local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"");
          }
          else {
            local_2a8._16_8_ = local_288;
            std::__cxx11::string::_M_construct<char_const*>((string *)(local_2a8 + 0x10),"[","");
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::ostream::operator<<(local_1a8,local_348);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            uVar12 = 0xf;
            if ((ulong *)local_2a8._16_8_ != local_288) {
              uVar12 = local_288[0];
            }
            if (uVar12 < (ulong)(local_250 + local_290)) {
              uVar12 = 0xf;
              if (local_258 != local_248) {
                uVar12 = local_248[0];
              }
              if (uVar12 < (ulong)(local_250 + local_290)) goto LAB_009556e8;
              puVar5 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_258,0,(char *)0x0,local_2a8._16_8_);
            }
            else {
LAB_009556e8:
              puVar5 = (undefined8 *)
                       std::__cxx11::string::_M_append(local_2a8 + 0x10,(ulong)local_258);
            }
            plVar4 = puVar5 + 2;
            if ((long *)*puVar5 == plVar4) {
              local_2c8 = *plVar4;
              uStack_2c0 = puVar5[3];
              local_2d8 = &local_2c8;
            }
            else {
              local_2c8 = *plVar4;
              local_2d8 = (long *)*puVar5;
            }
            local_2d0 = puVar5[1];
            *puVar5 = plVar4;
            puVar5[1] = 0;
            *(undefined1 *)plVar4 = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_2d8);
            local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
            psVar7 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_340.field_2._M_allocated_capacity = *psVar7;
              local_340.field_2._8_8_ = plVar4[3];
            }
            else {
              local_340.field_2._M_allocated_capacity = *psVar7;
              local_340._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_340._M_string_length = plVar4[1];
            *plVar4 = (long)psVar7;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
          }
          if (0 < iVar1) {
            if (local_2d8 != &local_2c8) {
              operator_delete(local_2d8,local_2c8 + 1);
            }
            if (local_258 != local_248) {
              operator_delete(local_258,local_248[0] + 1);
            }
            if ((ulong *)local_2a8._16_8_ != local_288) {
              operator_delete((void *)local_2a8._16_8_,local_288[0] + 1);
            }
          }
          std::operator+(local_1a8,(char *)*puVar2,&local_340);
          if (bVar16 && bVar15) {
            __s = (char *)puVar2[5];
            if (__s != (char *)0x0) {
              __s = (char *)puVar2[4];
            }
            std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,__s,&local_342);
            plVar4 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_1c8,(ulong)local_340._M_dataplus._M_p);
            plVar6 = plVar4 + 2;
            if ((long *)*plVar4 == plVar6) {
              local_218 = *plVar6;
              lStack_210 = plVar4[3];
              local_228 = &local_218;
            }
            else {
              local_218 = *plVar6;
              local_228 = (long *)*plVar4;
            }
            local_220 = plVar4[1];
            *plVar4 = (long)plVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_228);
            plVar6 = plVar4 + 2;
            if ((long *)*plVar4 == plVar6) {
              local_2e8 = *plVar6;
              lStack_2e0 = plVar4[3];
              local_2f8 = &local_2e8;
            }
            else {
              local_2e8 = *plVar6;
              local_2f8 = (long *)*plVar4;
            }
            local_2f0 = plVar4[1];
            *plVar4 = (long)plVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
          }
          else {
            local_2f8 = &local_2e8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"");
          }
          if (bVar16 && bVar15) {
            if (local_228 != &local_218) {
              operator_delete(local_228,local_218 + 1);
            }
            if (local_1c8[0] != local_1b8) {
              operator_delete(local_1c8[0],local_1b8[0] + 1);
            }
          }
          iVar3 = UniformLayout::getBlockIndex(local_230,local_1a8[0]._M_dataplus._M_p);
          pBVar8 = local_1f8;
          for (pBVar10 = (local_238->blocks).
                         super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage; pBVar10 != (pointer)0x0
              ; pBVar10 = *(pointer *)
                           ((long)&(pBVar10->name).field_2 + (ulong)(pBVar10->size < iVar3) * 8)) {
            if (iVar3 <= pBVar10->size) {
              pBVar8 = pBVar10;
            }
          }
          pBVar10 = local_1f8;
          if ((pBVar8 != local_1f8) && (pBVar10 = pBVar8, iVar3 < pBVar8->size)) {
            pBVar10 = local_1f8;
          }
          lVar11 = puVar2[8];
          if (lVar11 != puVar2[9]) {
            layout_00 = (UniformLayout *)
                        (pBVar10->activeUniformIndices).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
            do {
              if ((*(uint *)(lVar11 + 0x38) & uVar14) == 0) {
                local_2b8[0] = (VarType *)local_2a8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_2b8,local_2f8,local_2f0 + (long)local_2f8);
                std::__cxx11::string::append((char *)local_2b8);
                type = local_2b8[0];
                local_278[0] = local_268;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_278,local_320,local_318 + (long)local_320);
                std::__cxx11::string::append((char *)local_278);
                generateCompareSrc(local_1f0,(char *)(lVar11 + 0x20),type,(char *)local_278[0],
                                   (char *)local_230,layout_00,
                                   (void *)CONCAT44(in_stack_fffffffffffffc9c,uVar14),
                                   in_stack_fffffffffffffca0);
                if (local_278[0] != local_268) {
                  operator_delete(local_278[0],local_268[0] + 1);
                }
                if (local_2b8[0] != (VarType *)local_2a8) {
                  operator_delete(local_2b8[0],local_2a8._0_8_ + 1);
                }
              }
              lVar11 = lVar11 + 0x40;
            } while (lVar11 != puVar2[9]);
          }
          if (local_2f8 != &local_2e8) {
            operator_delete(local_2f8,local_2e8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
          }
          local_348 = local_348 + 1;
        } while (local_348 != iVar9);
        if (local_320 != &local_310) {
          operator_delete(local_320,local_310 + 1);
        }
      }
      local_200 = local_200 + 1;
      lVar11 = *(long *)(local_208 + 0x18);
    } while (local_200 < (int)((ulong)(*(long *)(local_208 + 0x20) - lVar11) >> 3));
  }
  return;
}

Assistant:

void generateCompareSrc (std::ostringstream& src, const char* resultVar, const ShaderInterface& interface, const UniformLayout& layout, const std::map<int, void*>& blockPointers, bool isVertex)
{
	deUint32 unusedMask = isVertex ? UNUSED_VERTEX : UNUSED_FRAGMENT;

	for (int blockNdx = 0; blockNdx < interface.getNumUniformBlocks(); blockNdx++)
	{
		const UniformBlock& block = interface.getUniformBlock(blockNdx);

		if ((block.getFlags() & (isVertex ? DECLARE_VERTEX : DECLARE_FRAGMENT)) == 0)
			continue; // Skip.

		bool			hasInstanceName	= block.getInstanceName() != DE_NULL;
		bool			isArray			= block.isArray();
		int				numInstances	= isArray ? block.getArraySize() : 1;
		std::string		apiPrefix		= hasInstanceName ? string(block.getBlockName()) + "." : string("");

		DE_ASSERT(!isArray || hasInstanceName);

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			std::string		instancePostfix		= isArray ? string("[") + de::toString(instanceNdx) + "]" : string("");
			std::string		blockInstanceName	= block.getBlockName() + instancePostfix;
			std::string		srcPrefix			= hasInstanceName ? string(block.getInstanceName()) + instancePostfix + "." : string("");
			int				activeBlockNdx		= layout.getBlockIndex(blockInstanceName.c_str());
			void*			basePtr				= blockPointers.find(activeBlockNdx)->second;

			for (UniformBlock::ConstIterator uniformIter = block.begin(); uniformIter != block.end(); uniformIter++)
			{
				const Uniform& uniform = *uniformIter;

				if (uniform.getFlags() & unusedMask)
					continue; // Don't read from that uniform.

				generateCompareSrc(src, resultVar, uniform.getType(), (srcPrefix + uniform.getName()).c_str(), (apiPrefix + uniform.getName()).c_str(), layout, basePtr, unusedMask);
			}
		}
	}
}